

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void searchtest(void)

{
  int N_00;
  int iVar1;
  FILE *__stream;
  double *x;
  void *__ptr;
  myarima_object object;
  double temp2 [1200];
  double temp1 [1200];
  double temp [1200];
  FILE *ifp;
  int method;
  int allowmean;
  int allowdrift;
  double offset;
  int approximation;
  char *ic;
  int r;
  int N;
  double *xreg;
  double *inp;
  myarima_object obj;
  int stationary;
  int s;
  int D;
  int d;
  int Order_max;
  int Q_max;
  int P_max;
  int q_max;
  int p_max;
  int j;
  int i;
  
  __stream = fopen("../data/seriesB.txt","r");
  p_max = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = p_max, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp1 + (long)p_max + 0x4af);
      p_max = p_max + 1;
    }
    x = (double *)malloc((long)p_max << 3);
    __ptr = malloc(0);
    for (p_max = 0; p_max < N_00; p_max = p_max + 1) {
      x[p_max] = temp1[(long)p_max + 0x4af];
    }
    object = search_arima(x,N_00,1,0,1,1,0,0,5,0,0,"aic",0,(double *)0x0,0,0.0,0,1,0,0);
    printf("ic %g \n",object->ic);
    free(x);
    free(__ptr);
    myarima_free(object);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void searchtest() {
	int i,j,p_max,q_max,P_max,Q_max,Order_max,d,D,s,stationary;
	myarima_object obj;
	double *inp,*xreg;
	int N,r = 0;
	const char *ic = "aic";
	int approximation = 0;
	double offset = 0;
	int allowdrift,allowmean,method;

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * r);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}
	d = 1;
	D = 0;
	s = 0;
	P_max = 0;
	Q_max = 0;
	p_max = 1;
	q_max = 1;
	Order_max = 5;
	stationary = 0;
	allowdrift = 0;
	allowmean = 1;
	method = 0;

	obj = search_arima(inp,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,approximation, NULL,r,offset,allowdrift,allowmean,0,method);

	printf("ic %g \n",obj->ic);

	free(inp);
	free(xreg);
	myarima_free(obj);
}